

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

SUNErrCode N_VScaleAddMulti_ManyVector(int nvec,sunrealtype *a,N_Vector x,N_Vector *Y,N_Vector *Z)

{
  void *__ptr;
  void *__ptr_00;
  long in_RCX;
  long *in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  long in_R8;
  N_Vector *Zsub;
  N_Vector *Ysub;
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_40;
  undefined8 local_38;
  
  __ptr = malloc((long)in_EDI << 3);
  __ptr_00 = malloc((long)in_EDI << 3);
  for (local_38 = 0; local_38 < *(long *)*in_RDX; local_38 = local_38 + 1) {
    for (local_40 = 0; local_40 < in_EDI; local_40 = local_40 + 1) {
      *(undefined8 *)((long)__ptr + local_40 * 8) =
           *(undefined8 *)(*(long *)(**(long **)(in_RCX + local_40 * 8) + 0x10) + local_38 * 8);
      *(undefined8 *)((long)__ptr_00 + local_40 * 8) =
           *(undefined8 *)(*(long *)(**(long **)(in_R8 + local_40 * 8) + 0x10) + local_38 * 8);
    }
    N_VScaleAddMulti(in_EDI,in_RSI,*(undefined8 *)(*(long *)(*in_RDX + 0x10) + local_38 * 8),__ptr,
                     __ptr_00);
  }
  free(__ptr);
  free(__ptr_00);
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VScaleAddMulti)(int nvec, sunrealtype* a, N_Vector x,
                                      N_Vector* Y, N_Vector* Z)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i, j;
  N_Vector *Ysub, *Zsub;

  /* create arrays of nvec N_Vector pointers for reuse within loop */
  Ysub = Zsub = NULL;
  Ysub        = (N_Vector*)malloc(nvec * sizeof(N_Vector));
  SUNAssert(Ysub, SUN_ERR_MALLOC_FAIL);
  Zsub = (N_Vector*)malloc(nvec * sizeof(N_Vector));
  SUNAssert(Zsub, SUN_ERR_MALLOC_FAIL);

  /* perform operation by calling N_VScaleAddMulti for each subvector */
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* for each subvector, create the array of subvectors of Y and Z */
    for (j = 0; j < nvec; j++)
    {
      Ysub[j] = MANYVECTOR_SUBVEC(Y[j], i);
      Zsub[j] = MANYVECTOR_SUBVEC(Z[j], i);
    }

    /* now call N_VScaleAddMulti for this array of subvectors */
    SUNCheckCall(N_VScaleAddMulti(nvec, a, MANYVECTOR_SUBVEC(x, i), Ysub, Zsub));
  }

  /* clean up and return */
  free(Ysub);
  free(Zsub);
  return SUN_SUCCESS;
}